

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O2

void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vFrontier;
  Aig_Obj_t *pObj_00;
  void *pvVar4;
  Ssw_Sat_t *pSVar5;
  
  pSVar5 = p;
  iVar2 = Ssw_ObjSatNum(p,pObj);
  if (iVar2 != 0) {
    return;
  }
  vFrontier = Vec_PtrAlloc((int)pSVar5);
  Ssw_ObjAddToFrontier(p,pObj,vFrontier);
  iVar2 = 0;
  while( true ) {
    if (vFrontier->nSize <= iVar2) {
      Vec_PtrFree(vFrontier);
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vFrontier,iVar2);
    iVar3 = Ssw_ObjSatNum(p,pObj_00);
    if (iVar3 == 0) break;
    iVar3 = Aig_ObjIsMuxType(pObj_00);
    pVVar1 = p->vFanins;
    if (iVar3 == 0) {
      Ssw_CollectSuper(pObj_00,1,pVVar1);
      for (iVar3 = 0; pVVar1 = p->vFanins, iVar3 < pVVar1->nSize; iVar3 = iVar3 + 1) {
        pvVar4 = Vec_PtrEntry(pVVar1,iVar3);
        Ssw_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe),vFrontier);
      }
      Ssw_AddClausesSuper(p,pObj_00,pVVar1);
    }
    else {
      pVVar1->nSize = 0;
      Vec_PtrPushUnique(pVVar1,(void *)(*(ulong *)(((ulong)pObj_00->pFanin0 & 0xfffffffffffffffe) +
                                                  8) & 0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe) + 8) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pObj_00->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      Vec_PtrPushUnique(p->vFanins,
                        (void *)(*(ulong *)(((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                                0xfffffffffffffffe));
      for (iVar3 = 0; iVar3 < p->vFanins->nSize; iVar3 = iVar3 + 1) {
        pvVar4 = Vec_PtrEntry(p->vFanins,iVar3);
        Ssw_ObjAddToFrontier(p,(Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe),vFrontier);
      }
      Ssw_AddClausesMux(p,pObj_00);
    }
    iVar2 = iVar2 + 1;
    if (p->vFanins->nSize < 2) {
      __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCnf.c"
                    ,0x181,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
    }
  }
  __assert_fail("Ssw_ObjSatNum(p,pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCnf.c"
                ,0x16e,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_CnfNodeAddToSolver( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Ssw_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ssw_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesMux( p, pNode );
        }
        else
        {
            Ssw_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}